

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::BP5Writer::WriteMetaMetadata
          (BP5Writer *this,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *MetaMetaBlocks)

{
  TransportMan *this_00;
  pointer pMVar1;
  size_t *buffer;
  pointer pMVar2;
  
  pMVar2 = (MetaMetaBlocks->
           super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (MetaMetaBlocks->
           super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar2 != pMVar1) {
    this_00 = &this->m_FileMetaMetadataManager;
    buffer = &pMVar2->MetaMetaIDLen;
    do {
      transportman::TransportMan::WriteFiles(this_00,(char *)buffer,8,-1);
      transportman::TransportMan::WriteFiles(this_00,(char *)(buffer + -2),8,-1);
      transportman::TransportMan::WriteFiles(this_00,(char *)buffer[-1],*buffer,-1);
      transportman::TransportMan::WriteFiles
                (this_00,((MetaMetaInfoBlock *)(buffer + -3))->MetaMetaInfo,buffer[-2],-1);
      pMVar2 = (pointer)(buffer + 1);
      buffer = buffer + 4;
    } while (pMVar2 != pMVar1);
  }
  transportman::TransportMan::FlushFiles(&this->m_FileMetaMetadataManager,-1);
  return;
}

Assistant:

void BP5Writer::WriteMetaMetadata(
    const std::vector<format::BP5Base::MetaMetaInfoBlock> MetaMetaBlocks)
{
    for (auto &b : MetaMetaBlocks)
    {
        m_FileMetaMetadataManager.WriteFiles((char *)&b.MetaMetaIDLen, sizeof(size_t));
        m_FileMetaMetadataManager.WriteFiles((char *)&b.MetaMetaInfoLen, sizeof(size_t));
        m_FileMetaMetadataManager.WriteFiles((char *)b.MetaMetaID, b.MetaMetaIDLen);
        m_FileMetaMetadataManager.WriteFiles((char *)b.MetaMetaInfo, b.MetaMetaInfoLen);
    }
    m_FileMetaMetadataManager.FlushFiles();
}